

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O0

const_varint_iterator<long> * __thiscall
protozero::const_varint_iterator<long>::operator++(const_varint_iterator<long> *this)

{
  assert_error *this_00;
  const_varint_iterator<long> *this_local;
  
  if (this->m_data == (char *)0x0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"m_data");
    __cxa_throw(this_00,&assert_error::typeinfo,assert_error::~assert_error);
  }
  skip_varint(&this->m_data,this->m_end);
  return this;
}

Assistant:

const_varint_iterator& operator++() {
        protozero_assert(m_data);
        skip_varint(&m_data, m_end);
        return *this;
    }